

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall cs::structure::structure(structure *this,structure *s)

{
  size_t sVar1;
  
  this->m_shadow = true;
  std::__cxx11::string::string((string *)&this->m_name,(string *)&s->m_name);
  std::__shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>,
             &(s->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>);
  sVar1 = (s->m_id).type_hash;
  (this->m_id).type_idx._M_target = (s->m_id).type_idx._M_target;
  (this->m_id).type_hash = sVar1;
  return;
}

Assistant:

explicit structure(const structure *s) : m_shadow(true), m_id(s->m_id), m_name(s->m_name),
			m_data(s->m_data) {}